

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::computeInitialDt
          (NavierStokesBase *this,int finest_level,int param_3,
          Vector<int,_std::allocator<int>_> *n_cycle,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *param_5,
          Vector<double,_std::allocator<double>_> *dt_level,Real stop_time)

{
  double *pdVar1;
  int *piVar2;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  Real RVar3;
  double dVar4;
  Real cur_time;
  Real eps;
  int n_factor;
  Real dt_0;
  int i;
  NavierStokesBase *in_stack_00000130;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  NavierStokesBase *in_stack_ffffffffffffff80;
  StateData *in_stack_ffffffffffffffa0;
  double local_50;
  int local_44;
  double local_40;
  int local_34;
  double local_30;
  int local_c;
  
  if (*(int *)(in_RDI + 8) < 1) {
    local_40 = 1e+100;
    local_44 = 1;
    local_30 = in_XMM0_Qa;
    local_c = in_ESI;
    for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
      getLevel(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      RVar3 = initialTimeStep(in_stack_00000130);
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *pdVar1 = RVar3;
      piVar2 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_44 = *piVar2 * local_44;
      dVar4 = (double)local_44;
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_50 = dVar4 * *pdVar1;
      pdVar1 = std::min<double>(&local_40,&local_50);
      local_40 = *pdVar1;
    }
    if (0.0 <= local_30) {
      dVar4 = local_40 * 0.0001;
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_ffffffffffffff80,
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      RVar3 = amrex::StateData::curTime(in_stack_ffffffffffffffa0);
      if (local_30 - dVar4 < RVar3 + local_40) {
        local_40 = local_30 - RVar3;
      }
    }
    local_44 = 1;
    for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
      piVar2 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_44 = *piVar2 * local_44;
      in_stack_ffffffffffffff80 = (NavierStokesBase *)(local_40 / (double)local_44);
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      *pdVar1 = (double)in_stack_ffffffffffffff80;
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::computeInitialDt (int                   finest_level,
				    int                   /*sub_cycle*/,
				    Vector<int>&           n_cycle,
				    const Vector<IntVect>& /*ref_ratio*/,
				    Vector<Real>&          dt_level,
				    Real                  stop_time)
{
    //
    // Grids have been constructed, compute dt for all levels.
    //
    if (level > 0)
        return;

    int i;

    Real dt_0    = 1.0e+100;
    int n_factor = 1;
    ///TODO/DEBUG: This will need to change for optimal subcycling.
    for (i = 0; i <= finest_level; i++)
    {
        dt_level[i] = getLevel(i).initialTimeStep();
        n_factor   *= n_cycle[i];
        dt_0        = std::min(dt_0,n_factor*dt_level[i]);
    }

    //
    // Limit dt's by the value of stop_time.
    //
    if (stop_time >= 0.0)
    {
        const Real eps      = 0.0001*dt_0;
        const Real cur_time = state[State_Type].curTime();
        if ((cur_time + dt_0) > (stop_time - eps))
            dt_0 = stop_time - cur_time;
    }

    n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        n_factor   *= n_cycle[i];
        dt_level[i] = dt_0/( (Real)n_factor );
    }
}